

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O3

void __thiscall ProfileHandler::UpdateTimer(ProfileHandler *this,bool enable)

{
  int iVar1;
  undefined1 local_28 [8];
  itimerval timer;
  
  if ((this->per_thread_timer_enabled_ == false) && (this->timer_running_ != enable)) {
    this->timer_running_ = enable;
    iVar1 = 0;
    if (enable) {
      iVar1 = (int)(1000000 / (long)this->frequency_);
    }
    local_28 = (undefined1  [8])(long)(iVar1 / 1000000);
    timer.it_interval.tv_sec = (__time_t)(iVar1 % 1000000);
    timer.it_interval.tv_usec = (__suseconds_t)local_28;
    timer.it_value.tv_sec = timer.it_interval.tv_sec;
    setitimer(this->timer_type_,(itimerval *)local_28,(itimerval *)0x0);
  }
  return;
}

Assistant:

void ProfileHandler::UpdateTimer(bool enable) {
  if (per_thread_timer_enabled_) {
    // Ignore any attempts to disable it because that's not supported, and it's
    // always enabled so enabling is always a NOP.
    return;
  }

  if (enable == timer_running_) {
    return;
  }
  timer_running_ = enable;

  struct itimerval timer;
  static const int kMillion = 1000000;
  int interval_usec = enable ? kMillion / frequency_ : 0;
  timer.it_interval.tv_sec = interval_usec / kMillion;
  timer.it_interval.tv_usec = interval_usec % kMillion;
  timer.it_value = timer.it_interval;
  setitimer(timer_type_, &timer, 0);
}